

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O0

size_t COST_SENSITIVE::read_cached_label(shared_data *param_1,void *v,io_buf *cache)

{
  size_t sVar1;
  io_buf *in_RSI;
  char *in_RDI;
  size_t total;
  char *c;
  label *ld;
  v_array<COST_SENSITIVE::wclass> *in_stack_ffffffffffffffd0;
  label *in_stack_fffffffffffffff8;
  
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffffd0);
  sVar1 = io_buf::buf_read((io_buf *)c,(char **)total,(size_t)in_stack_fffffffffffffff8);
  if (sVar1 < 8) {
    sVar1 = 0;
  }
  else {
    bufread_label(in_stack_fffffffffffffff8,in_RDI,in_RSI);
    sVar1 = 8;
  }
  return sVar1;
}

Assistant:

size_t read_cached_label(shared_data*, void* v, io_buf& cache)
{
  label* ld = (label*)v;
  ld->costs.clear();
  char* c;
  size_t total = sizeof(size_t);
  if (cache.buf_read(c, (int)total) < total)
    return 0;
  bufread_label(ld, c, cache);

  return total;
}